

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O3

int wally_varint_to_bytes(uint64_t value,uchar *bytes_out,size_t len,size_t *written)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar1 = -2;
  if (bytes_out != (uchar *)0x0) {
    if (value < 0xfd) {
      if (len == 0 || written == (size_t *)0x0) {
        return -2;
      }
      *bytes_out = (uchar)value;
      sVar2 = 1;
    }
    else {
      uVar3 = 3;
      if (0xffff < value) {
        uVar3 = (ulong)(value >> 0x20 != 0) * 4 + 5;
      }
      if (len < uVar3 || written == (size_t *)0x0) {
        return -2;
      }
      if (value < 0x10000) {
        *bytes_out = 0xfd;
        *(short *)(bytes_out + 1) = (short)value;
        sVar2 = 3;
      }
      else if (value >> 0x20 == 0) {
        *bytes_out = 0xfe;
        *(int *)(bytes_out + 1) = (int)value;
        sVar2 = 5;
      }
      else {
        *bytes_out = 0xff;
        *(uint64_t *)(bytes_out + 1) = value;
        sVar2 = 9;
      }
    }
    *written = sVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int wally_varint_to_bytes(uint64_t value, unsigned char *bytes_out, size_t len, size_t *written)
{
    if (written)
        *written = 0;
    if (!bytes_out || len < varint_get_length(value) || !written)
        return WALLY_EINVAL;
    *written = varint_to_bytes(value, bytes_out);
    return WALLY_OK;
}